

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataAllocator::AssignPointer
          (ColumnDataAllocator *this,uint32_t *block_id,uint32_t *offset,data_ptr_t pointer)

{
  uintptr_t pointer_value;
  
  *block_id = (uint32_t)pointer;
  *offset = (uint32_t)((ulong)pointer >> 0x20);
  return;
}

Assistant:

void ColumnDataAllocator::AssignPointer(uint32_t &block_id, uint32_t &offset, data_ptr_t pointer) {
	auto pointer_value = uintptr_t(pointer);
	if (sizeof(uintptr_t) == sizeof(uint32_t)) {
		block_id = uint32_t(pointer_value);
	} else if (sizeof(uintptr_t) == sizeof(uint64_t)) {
		block_id = uint32_t(pointer_value & 0xFFFFFFFF);
		offset = uint32_t(pointer_value >> 32);
	} else {
		throw InternalException("ColumnDataCollection: Architecture not supported!?");
	}
}